

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject_p.h
# Opt level: O0

bool comparesEqual(QArgumentType *lhs,QArgumentType *rhs)

{
  bool bVar1;
  QArgumentType *in_RSI;
  QArgumentType *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9c;
  undefined1 uVar2;
  undefined2 in_stack_ffffffffffffff9e;
  bool local_49;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = QArgumentType::metaType(in_RSI);
  bVar1 = QMetaType::isValid(&local_10);
  uVar2 = false;
  if (bVar1) {
    local_18 = QArgumentType::metaType(in_RSI);
    uVar2 = QMetaType::isValid(&local_18);
  }
  if ((bool)uVar2 == false) {
    QArgumentType::name(in_RDI);
    QArgumentType::name(in_RDI);
    local_49 = operator==((QByteArrayView *)in_RSI,
                          (QByteArrayView *)
                          CONCAT26(in_stack_ffffffffffffff9e,
                                   CONCAT15(uVar2,CONCAT14(in_stack_ffffffffffffff9c,
                                                           in_stack_ffffffffffffff98))));
  }
  else {
    QArgumentType::metaType(in_RSI);
    QArgumentType::metaType(in_RSI);
    local_49 = operator==(&in_RSI->_metaType,
                          (QMetaType *)
                          CONCAT26(in_stack_ffffffffffffff9e,
                                   CONCAT15(uVar2,CONCAT14(in_stack_ffffffffffffff9c,
                                                           in_stack_ffffffffffffff98))));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_49;
}

Assistant:

bool comparesEqual(const QArgumentType &lhs,
                              const QArgumentType &rhs)
    {
        if (lhs.metaType().isValid() && rhs.metaType().isValid())
            return lhs.metaType() == rhs.metaType();
        else
            return lhs.name() == rhs.name();
    }